

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

bool __thiscall Tetris::same(Tetris *this,Tetris *x)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  pair<int,_int> in_RSI;
  long in_RDI;
  int j;
  bool ok;
  int tmpY;
  int tmpX;
  int i;
  pair<int,_int> hash [4];
  pair<int,_int> *local_60;
  int local_4c;
  int local_3c;
  pair<int,_int> local_38 [4];
  pair<int,_int> local_18 [2];
  bool local_1;
  
  if (*(int *)(in_RDI + 8) == *(int *)((long)in_RSI + 8)) {
    local_60 = local_38;
    local_18[0] = in_RSI;
    do {
      std::pair<int,_int>::pair<int,_int,_true>(local_60);
      local_60 = local_60 + 1;
    } while (local_60 != local_18);
    for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
      iVar1 = *(int *)(in_RDI + 0x10);
      iVar2 = *(int *)(*(long *)(in_RDI + 0x18) + (long)*(int *)(in_RDI + 0x14) * 0x20 +
                      (long)(local_3c * 2 + 1) * 4);
      local_38[local_3c].first =
           *(int *)(in_RDI + 0xc) +
           *(int *)(*(long *)(in_RDI + 0x18) + (long)*(int *)(in_RDI + 0x14) * 0x20 +
                   (long)(local_3c << 1) * 4);
      local_18[(long)local_3c + -4].second = iVar1 + iVar2;
    }
    for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
      bVar4 = false;
      local_4c = 0;
      while( true ) {
        bVar3 = false;
        if (local_4c < 4) {
          bVar3 = (bool)(bVar4 ^ 1);
        }
        if (!bVar3) break;
        if ((local_38[local_4c].first ==
             *(int *)((long)local_18[0] + 0xc) +
             *(int *)(*(long *)((long)local_18[0] + 0x18) +
                      (long)*(int *)((long)local_18[0] + 0x14) * 0x20 + (long)(local_3c << 1) * 4))
           && (local_18[(long)local_4c + -4].second ==
               *(int *)((long)local_18[0] + 0x10) +
               *(int *)(*(long *)((long)local_18[0] + 0x18) +
                        (long)*(int *)((long)local_18[0] + 0x14) * 0x20 +
                       (long)(local_3c * 2 + 1) * 4))) {
          bVar4 = true;
        }
        local_4c = local_4c + 1;
      }
      if (!bVar4) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Tetris::same(const Tetris &x)
{
    if (blockType != x.blockType)
        return false;
    pair<int, int> hash[4];
    int i, tmpX, tmpY;
    for (i = 0; i < 4; i++) {
        tmpX = blockX + shape[orientation][2 * i];
        tmpY = blockY + shape[orientation][2 * i + 1];
        hash[i].first = tmpX, hash[i].second = tmpY;
    }
    for (i = 0; i < 4; i++) {
        tmpX = x.blockX + x.shape[x.orientation][2 * i];
        tmpY = x.blockY + x.shape[x.orientation][2 * i + 1];
        bool ok = false;
        for (int j = 0; j < 4 && !ok; ++j)
            if (hash[j].first == tmpX && hash[j].second == tmpY)
                ok = true;
        if (!ok)
            return false;
    }
    return true;
}